

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O3

void google::protobuf::File::ReadFileToStringOrDie(string *name,string *output)

{
  Nonnull<const_char_*> failure_msg;
  string_view str;
  StatusRep *local_28 [2];
  
  ReadFileToString((File *)local_28,name,output,false);
  if (local_28[0] == (StatusRep *)0x1) {
    return;
  }
  failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_28,
                           "ReadFileToString(name, output) is OK");
  if (((ulong)local_28[0] & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref(local_28[0]);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
             ,0x4d,failure_msg);
  str._M_str = "Could not read: ";
  str._M_len = 0x10;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
            ((LogMessage *)local_28,str);
  absl::lts_20250127::log_internal::LogMessage::operator<<((LogMessage *)local_28,name);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

void File::ReadFileToStringOrDie(const std::string& name, std::string* output) {
  ABSL_CHECK_OK(ReadFileToString(name, output)) << "Could not read: " << name;
}